

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O1

int __thiscall
UnifiedRegex::ChompCharGroupInst<(UnifiedRegex::ChompMode)0>::Print
          (ChompCharGroupInst<(UnifiedRegex::ChompMode)0> *this,DebugWriter *w,Label label,
          Char *litbuf)

{
  undefined4 in_register_00000014;
  char16_t *pcVar1;
  Inst *inst;
  DebugWriter *this_00;
  
  DebugWriter::Print(w,L"L%04x: ",CONCAT44(in_register_00000014,label));
  if (DAT_015d347d == '\x01') {
    DebugWriter::Print(w,L"(0x%03x bytes) ",8);
  }
  DebugWriter::Print(w,L"ChompCharGroup<Star>");
  DebugWriter::Print(w,L"(");
  DebugWriter::Print(w,L"c: ");
  DebugWriter::PrintQuotedChar(w,(this->super_CharMixin).c);
  DebugWriter::Print(w,L", ");
  DebugWriter::Print(w,L"groupId: %d",(ulong)(uint)(this->super_GroupMixin).groupId);
  DebugWriter::Print(w,L", ");
  pcVar1 = L"false";
  if ((this->super_NoNeedToSaveMixin).noNeedToSave != false) {
    pcVar1 = L"true";
  }
  DebugWriter::Print(w,L"noNeedToSave: %s",pcVar1);
  DebugWriter::PrintEOL(w,L")");
  if (DAT_015d347d == '\x01') {
    this_00 = w;
    DebugWriter::Indent(w);
    Inst::PrintBytes<UnifiedRegex::Inst>((Inst *)this_00,w,inst,&this->super_Inst,L"Inst");
    Inst::PrintBytes<UnifiedRegex::CharMixin>
              (&this->super_Inst,w,&this->super_Inst,&this->super_CharMixin,L"CharMixin");
    Inst::PrintBytes<UnifiedRegex::GroupMixin>
              (&this->super_Inst,w,&this->super_Inst,&this->super_GroupMixin,L"GroupMixin");
    Inst::PrintBytes<UnifiedRegex::NoNeedToSaveMixin>
              (&this->super_Inst,w,&this->super_Inst,&this->super_NoNeedToSaveMixin,
               L"NoNeedToSaveMixin");
    DebugWriter::Unindent(w);
  }
  return 8;
}

Assistant:

int ChompCharGroupInst<Mode>::Print(DebugWriter* w, Label label, const Char* litbuf) const
    {
        if (Mode == ChompMode::Star)
        {
            PRINT_RE_BYTECODE_BEGIN("ChompCharGroup<Star>");
        }
        else
        {
            PRINT_RE_BYTECODE_BEGIN("ChompCharGroup<Plus>");
        }

        PRINT_MIXIN_COMMA(CharMixin);
        PRINT_MIXIN_COMMA(GroupMixin);
        PRINT_MIXIN(NoNeedToSaveMixin);
        PRINT_RE_BYTECODE_MID();
        PRINT_BYTES(CharMixin);
        PRINT_BYTES(GroupMixin);
        PRINT_BYTES(NoNeedToSaveMixin);
        PRINT_RE_BYTECODE_END();
    }